

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O3

SharedLiterals *
Clasp::SharedLiterals::newShareable(Literal *lits,uint32 size,ConstraintType t,uint32 numRefs)

{
  SharedLiterals *pSVar1;
  
  pSVar1 = (SharedLiterals *)operator_new((ulong)(size * 4 + 8));
  pSVar1->size_type_ = t + size * 4;
  LOCK();
  (pSVar1->refCount_).super___atomic_base<int>._M_i = numRefs + (numRefs == 0);
  UNLOCK();
  if (lits != (Literal *)0x0) {
    memcpy(pSVar1 + 1,lits,(ulong)size << 2);
  }
  return pSVar1;
}

Assistant:

SharedLiterals* SharedLiterals::newShareable(const Literal* lits, uint32 size, ConstraintType t, uint32 numRefs) {
	void* m = Detail::alloc(sizeof(SharedLiterals)+(size*sizeof(Literal)));
	return new (m) SharedLiterals(lits, size, t, numRefs);
}